

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<unsigned_int> * __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::getTypeIndex
          (Result<unsigned_int> *__return_storage_ptr__,
          TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx> *this,Name id)

{
  bool bVar1;
  ParseImplicitTypeDefsCtx *pPVar2;
  pointer pvVar3;
  allocator<char> local_79;
  string local_78;
  Err local_58;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_38;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_30;
  const_iterator it;
  TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx> *this_local;
  Name id_local;
  
  id_local.super_IString.str._M_len = id.super_IString.str._M_str;
  this_local = id.super_IString.str._M_len;
  it.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)this;
  id_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::find(this->typeIndices,(key_type *)&this_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::end(this->typeIndices);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    pPVar2 = self(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"unknown type identifier",&local_79);
    Lexer::err(&local_58,&pPVar2->in,&local_78);
    Result<unsigned_int>::Result(__return_storage_ptr__,&local_58);
    wasm::Err::~Err(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>
                         *)&local_30);
    Result<unsigned_int>::Result<unsigned_int_const&>(__return_storage_ptr__,&pvVar3->second);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getTypeIndex(Name id) {
    auto it = typeIndices.find(id);
    if (it == typeIndices.end()) {
      return self().in.err("unknown type identifier");
    }
    return it->second;
  }